

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixy-pktgen.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint32_t uVar3;
  ixy_device *dev;
  mempool *mempool;
  pkt_buf *ppVar4;
  uint64_t uVar5;
  uint32_t cs;
  uint uVar6;
  long lVar7;
  int buf_id_1;
  ulong uVar8;
  int buf_id;
  long lVar9;
  ulong uVar10;
  pkt_buf *local_4288 [63];
  undefined8 uStack_4090;
  undefined1 auStack_4088 [8];
  device_stats stats_old;
  undefined1 auStack_88 [8];
  device_stats stats;
  uint64_t local_40;
  ulong local_38;
  
  if (argc == 2) {
    uStack_4090 = 0x1023dc;
    dev = ixy_init(argv[1],1,1,0);
    uStack_4090 = 0x1023eb;
    mempool = memory_allocate_mempool(0x800,0);
    uStack_4090 = 0x27;
    for (lVar9 = 0; lVar9 != 0x800; lVar9 = lVar9 + 1) {
      uStack_4090 = 0x10240c;
      ppVar4 = pkt_buf_alloc(mempool);
      ppVar4->size = 0x3c;
      uVar6 = 0;
      ppVar4[1].buf_addr_phy = 0x1010060504030201;
      ppVar4[1].mempool = (mempool *)0x45000810101010;
      *(undefined8 *)&ppVar4[1].mempool_idx = 0x1140000000002e00;
      ppVar4[1].head_room[0] = '\0';
      ppVar4[1].head_room[1] = '\0';
      ppVar4[1].head_room[2] = '\n';
      ppVar4[1].head_room[3] = '\0';
      ppVar4[1].head_room[4] = '\0';
      ppVar4[1].head_room[5] = '\x01';
      ppVar4[1].head_room[6] = '\n';
      ppVar4[1].head_room[7] = '\0';
      puVar1 = (uint8_t *)((long)&ppVar4[1].mempool + 5);
      puVar1[0] = '\0';
      puVar1[1] = 'E';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '.';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      puVar1 = (uint8_t *)((long)&ppVar4[1].size + 1);
      puVar1[0] = '\0';
      puVar1[1] = '@';
      puVar1[2] = '\x11';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\n';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      ppVar4[1].head_room[5] = '\x01';
      ppVar4[1].head_room[6] = '\n';
      ppVar4[1].head_room[7] = '\0';
      ppVar4[1].head_room[8] = '\0';
      ppVar4[1].head_room[9] = '\x02';
      ppVar4[1].head_room[10] = '\0';
      ppVar4[1].head_room[0xb] = '*';
      ppVar4[1].head_room[0xc] = '\x05';
      ppVar4[1].head_room[0xd] = '9';
      ppVar4[1].head_room[0xe] = '\0';
      ppVar4[1].head_room[0xf] = '\x1a';
      ppVar4[1].head_room[0x10] = '\0';
      ppVar4[1].head_room[0x11] = '\0';
      ppVar4[1].head_room[0x12] = 'i';
      ppVar4[1].head_room[0x13] = 'x';
      ppVar4[1].head_room[0x14] = 'y';
      for (lVar7 = 0x27; lVar7 != 0x31; lVar7 = lVar7 + 1) {
        uVar6 = uVar6 + *(ushort *)(ppVar4->head_room + lVar7 * 2 + -0x18);
        if (0xffff < uVar6) {
          uVar6 = (uVar6 & 0xffff) + 1;
        }
      }
      *(ushort *)ppVar4[1].head_room = ~(ushort)uVar6;
      *(pkt_buf **)(auStack_4088 + lVar9 * 8) = ppVar4;
    }
    for (lVar9 = 0; lVar9 != 0x800; lVar9 = lVar9 + 1) {
      uStack_4090 = 0x1024a2;
      pkt_buf_free(*(pkt_buf **)(auStack_4088 + lVar9 * 8));
    }
    uStack_4090 = 0x1024b1;
    local_40 = monotonic_time();
    uStack_4090 = 0x1024c1;
    stats_init((device_stats *)auStack_88,dev);
    uStack_4090 = 0x1024d4;
    stats_init((device_stats *)auStack_4088,dev);
    uVar10 = 0;
    local_38 = 0;
    do {
      pkt_buf_alloc_batch(mempool,local_4288,0x40);
      stats.tx_bytes = uVar10 & 0xffffffff;
      for (lVar9 = 0; uVar10 = stats.tx_bytes + lVar9, lVar9 != 0x40; lVar9 = lVar9 + 1) {
        *(int *)(local_4288[lVar9][1].head_room + 0x20) = (int)uVar10;
      }
      uVar8 = 0;
      do {
        uVar3 = (*dev->tx_batch)(dev,0,local_4288 + uVar8,0x40 - (int)uVar8);
        uVar6 = (int)uVar8 + uVar3;
        uVar8 = (ulong)uVar6;
      } while (uVar6 != 0x40);
      uVar8 = local_38 + 1;
      uVar2 = local_38 & 0xfff;
      local_38 = uVar8;
      if (uVar2 == 0) {
        uVar5 = monotonic_time();
        if (1000000000 < uVar5 - local_40) {
          (*dev->read_stats)(dev,(device_stats *)auStack_88);
          print_stats_diff((device_stats *)auStack_88,(device_stats *)auStack_4088,uVar5 - local_40)
          ;
          uVar10 = (ulong)((int)stats.tx_bytes + 0x40);
          local_40 = uVar5;
        }
      }
    } while( true );
  }
  uStack_4090 = 0x102475;
  printf("Usage: %s <pci bus id>\n",*argv);
  return 1;
}

Assistant:

int main(int argc, char* argv[]) {
	if (argc != 2) {
		printf("Usage: %s <pci bus id>\n", argv[0]);
		return 1;
	}

	struct ixy_device* dev = ixy_init(argv[1], 1, 1, 0);
	struct mempool* mempool = init_mempool();

	uint64_t last_stats_printed = monotonic_time();
	uint64_t counter = 0;
	struct device_stats stats_old, stats;
	stats_init(&stats, dev);
	stats_init(&stats_old, dev);
	uint32_t seq_num = 0;

	// array of bufs sent out in a batch
	struct pkt_buf* bufs[BATCH_SIZE];

	// tx loop
	while (true) {
		// we cannot immediately recycle packets, we need to allocate new packets every time
		// the old packets might still be used by the NIC: tx is async
		pkt_buf_alloc_batch(mempool, bufs, BATCH_SIZE);
		for (uint32_t i = 0; i < BATCH_SIZE; i++) {
			// packets can be modified here, make sure to update the checksum when changing the IP header
			*(uint32_t*)(bufs[i]->data + PKT_SIZE - 4) = seq_num++;
		}
		// the packets could be modified here to generate multiple flows
		ixy_tx_batch_busy_wait(dev, 0, bufs, BATCH_SIZE);

		// don't check time for every packet, this yields +10% performance :)
		if ((counter++ & 0xFFF) == 0) {
			uint64_t time = monotonic_time();
			if (time - last_stats_printed > 1000 * 1000 * 1000) {
				// every second
				ixy_read_stats(dev, &stats);
				print_stats_diff(&stats, &stats_old, time - last_stats_printed);
				stats_old = stats;
				last_stats_printed = time;
			}
		}
		// track stats
	}
}